

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_uint32 ma_get_format_priority_index(ma_format format)

{
  ma_uint32 i;
  long lVar1;
  ma_format *pmVar2;
  
  pmVar2 = g_maFormatPriorities;
  lVar1 = 0;
  do {
    if (*pmVar2 == format) goto LAB_001380e7;
    lVar1 = lVar1 + 1;
    pmVar2 = pmVar2 + 1;
  } while (lVar1 != 5);
  lVar1 = 0xffffffff;
LAB_001380e7:
  return (ma_uint32)lVar1;
}

Assistant:

MA_API ma_uint32 ma_get_format_priority_index(ma_format format) /* Lower = better. */
{
    ma_uint32 i;
    for (i = 0; i < ma_countof(g_maFormatPriorities); ++i) {
        if (g_maFormatPriorities[i] == format) {
            return i;
        }
    }

    /* Getting here means the format could not be found or is equal to ma_format_unknown. */
    return (ma_uint32)-1;
}